

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_primitive_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::csharp::PrimitiveFieldGenerator::WriteHash
          (PrimitiveFieldGenerator *this,Printer *printer)

{
  uint8_t uVar1;
  size_t sVar2;
  char *pcVar3;
  char *__s;
  string_view text;
  
  uVar1 = ((this->super_FieldGeneratorBase).descriptor_)->type_;
  pcVar3 = "if ($has_property_check$) hash ^= $property_name$.GetHashCode();\n";
  if (uVar1 == '\x01') {
    pcVar3 = 
    "if ($has_property_check$) hash ^= pbc::ProtobufEqualityComparers.BitwiseDoubleEqualityComparer.GetHashCode($property_name$);\n"
    ;
  }
  __s = 
  "if ($has_property_check$) hash ^= pbc::ProtobufEqualityComparers.BitwiseSingleEqualityComparer.GetHashCode($property_name$);\n"
  ;
  if (uVar1 != '\x02') {
    __s = pcVar3;
  }
  sVar2 = strlen(__s);
  text._M_str = __s;
  text._M_len = sVar2;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&(this->super_FieldGeneratorBase).variables_,text);
  return;
}

Assistant:

void PrimitiveFieldGenerator::WriteHash(io::Printer* printer) {
  const char *text = "if ($has_property_check$) hash ^= $property_name$.GetHashCode();\n";
  if (descriptor_->type() == FieldDescriptor::TYPE_FLOAT) {
    text = "if ($has_property_check$) hash ^= pbc::ProtobufEqualityComparers.BitwiseSingleEqualityComparer.GetHashCode($property_name$);\n";
  } else if (descriptor_->type() == FieldDescriptor::TYPE_DOUBLE) {
    text = "if ($has_property_check$) hash ^= pbc::ProtobufEqualityComparers.BitwiseDoubleEqualityComparer.GetHashCode($property_name$);\n";
  }
	printer->Print(variables_, text);
}